

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O3

size_t spdlog::details::os::thread_id(void)

{
  long lVar1;
  long lVar2;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  if (*(char *)(lVar1 + -8) != '\x01') {
    lVar2 = syscall(0xba);
    *(long *)(lVar1 + -0x10) = lVar2;
    *(undefined1 *)(lVar1 + -8) = 1;
  }
  return *(size_t *)(lVar1 + -0x10);
}

Assistant:

SPDLOG_INLINE size_t thread_id() SPDLOG_NOEXCEPT
{
#if defined(SPDLOG_NO_TLS)
    return _thread_id();
#else // cache thread id in tls
    static thread_local const size_t tid = _thread_id();
    return tid;
#endif
}